

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::Detail::registerListenerImpl(unique_ptr<Catch::EventListenerFactory> *listenerFactory)

{
  IMutableRegistryHub *this;
  unique_ptr<Catch::EventListenerFactory> *in_RDI;
  unique_ptr<Catch::EventListenerFactory> local_10 [2];
  
  this = getMutableRegistryHub();
  unique_ptr<Catch::EventListenerFactory>::unique_ptr(local_10,in_RDI);
  (*this->_vptr_IMutableRegistryHub[3])(this,local_10);
  unique_ptr<Catch::EventListenerFactory>::~unique_ptr
            ((unique_ptr<Catch::EventListenerFactory> *)this);
  return;
}

Assistant:

void registerListenerImpl( Detail::unique_ptr<EventListenerFactory> listenerFactory ) {
            getMutableRegistryHub().registerListener( CATCH_MOVE(listenerFactory) );
        }